

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O2

string * SkeletalMesh::Scene::testAllSuffix(string *__return_storage_ptr__,string *no_suffix_name)

{
  FILE *__stream;
  long lVar1;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string support_suffix [3];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)support_suffix,".obj",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix + 1),".dae",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix + 2),".fbx",&local_8b);
  lVar1 = 0;
  do {
    if (lVar1 == 0x60) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00126abd:
      lVar1 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&support_suffix[0]._M_dataplus._M_p + lVar1))
        ;
        lVar1 = lVar1 + -0x20;
      } while (lVar1 != -0x20);
      return __return_storage_ptr__;
    }
    std::operator+(__return_storage_ptr__,no_suffix_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&support_suffix[0]._M_dataplus._M_p + lVar1));
    __stream = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      goto LAB_00126abd;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    lVar1 = lVar1 + 0x20;
  } while( true );
}

Assistant:

static std::string testAllSuffix(std::string no_suffix_name) {
            const int support_suffix_num = 3;
            const std::string support_suffix[support_suffix_num] = {
                    ".obj",
                    ".dae",
                    ".fbx"
            };

            for (int i = 0; i < support_suffix_num; i++) {
                std::string try_filename = no_suffix_name + support_suffix[i];
                FILE *ftest = fopen(try_filename.c_str(), "r");
                if (ftest) {
                    fclose(ftest);
                    return try_filename;
                }
            }
            return std::string();
        }